

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

bool icu_63::numparse::impl::AffixMatcherWarehouse::isInteresting
               (AffixPatternProvider *patternInfo,IgnorablesMatcher *ignorables,
               parse_flags_t parseFlags,UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  UnicodeSet *pUVar3;
  UnicodeString negSuffixString;
  UnicodeString negPrefixString;
  UnicodeString posSuffixString;
  UnicodeString local_a8;
  UnicodeString posPrefixString;
  
  (*patternInfo->_vptr_AffixPatternProvider[4])(&posPrefixString,patternInfo,0x100);
  (*patternInfo->_vptr_AffixPatternProvider[4])(&posSuffixString,patternInfo,0);
  negPrefixString.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003a7268;
  negPrefixString.fUnion.fStackFields.fLengthAndFlags = 2;
  negSuffixString.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_003a7268;
  negSuffixString.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar2 = (*patternInfo->_vptr_AffixPatternProvider[7])(patternInfo);
  if ((char)iVar2 != '\0') {
    (*patternInfo->_vptr_AffixPatternProvider[4])(&local_a8,patternInfo,0x300);
    UnicodeString::moveFrom(&negPrefixString,&local_a8);
    UnicodeString::~UnicodeString(&local_a8);
    (*patternInfo->_vptr_AffixPatternProvider[4])(&local_a8,patternInfo,0x200);
    UnicodeString::moveFrom(&negSuffixString,&local_a8);
    UnicodeString::~UnicodeString(&local_a8);
  }
  if (((uint)parseFlags >> 8 & 1) == 0) {
    pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
    bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                      (&posPrefixString,pUVar3,status);
    if (bVar1) {
      pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
      bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                        (&posSuffixString,pUVar3,status);
      if (bVar1) {
        pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
        bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                          (&negPrefixString,pUVar3,status);
        if (bVar1) {
          pUVar3 = SymbolMatcher::getSet(&ignorables->super_SymbolMatcher);
          bVar1 = icu_63::number::impl::AffixUtils::containsOnlySymbolsAndIgnorables
                            (&negSuffixString,pUVar3,status);
          if (bVar1) {
            bVar1 = icu_63::number::impl::AffixUtils::containsType
                              (&posSuffixString,TYPE_PLUS_SIGN,status);
            if (!bVar1) {
              bVar1 = icu_63::number::impl::AffixUtils::containsType
                                (&posSuffixString,TYPE_MINUS_SIGN,status);
              if (!bVar1) {
                bVar1 = icu_63::number::impl::AffixUtils::containsType
                                  (&negSuffixString,TYPE_PLUS_SIGN,status);
                if (!bVar1) {
                  bVar1 = icu_63::number::impl::AffixUtils::containsType
                                    (&negSuffixString,TYPE_MINUS_SIGN,status);
                  if (!bVar1) {
                    bVar1 = false;
                    goto LAB_0026cd18;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = true;
LAB_0026cd18:
  UnicodeString::~UnicodeString(&negSuffixString);
  UnicodeString::~UnicodeString(&negPrefixString);
  UnicodeString::~UnicodeString(&posSuffixString);
  UnicodeString::~UnicodeString(&posPrefixString);
  return bVar1;
}

Assistant:

bool AffixMatcherWarehouse::isInteresting(const AffixPatternProvider& patternInfo,
                                          const IgnorablesMatcher& ignorables, parse_flags_t parseFlags,
                                          UErrorCode& status) {
    UnicodeString posPrefixString = patternInfo.getString(AffixPatternProvider::AFFIX_POS_PREFIX);
    UnicodeString posSuffixString = patternInfo.getString(AffixPatternProvider::AFFIX_POS_SUFFIX);
    UnicodeString negPrefixString;
    UnicodeString negSuffixString;
    if (patternInfo.hasNegativeSubpattern()) {
        negPrefixString = patternInfo.getString(AffixPatternProvider::AFFIX_NEG_PREFIX);
        negSuffixString = patternInfo.getString(AffixPatternProvider::AFFIX_NEG_SUFFIX);
    }

    if (0 == (parseFlags & PARSE_FLAG_USE_FULL_AFFIXES) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(posPrefixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(posSuffixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(negPrefixString, *ignorables.getSet(), status) &&
        AffixUtils::containsOnlySymbolsAndIgnorables(negSuffixString, *ignorables.getSet(), status)
        // HACK: Plus and minus sign are a special case: we accept them trailing only if they are
        // trailing in the pattern string.
        && !AffixUtils::containsType(posSuffixString, TYPE_PLUS_SIGN, status) &&
        !AffixUtils::containsType(posSuffixString, TYPE_MINUS_SIGN, status) &&
        !AffixUtils::containsType(negSuffixString, TYPE_PLUS_SIGN, status) &&
        !AffixUtils::containsType(negSuffixString, TYPE_MINUS_SIGN, status)) {
        // The affixes contain only symbols and ignorables.
        // No need to generate affix matchers.
        return false;
    }
    return true;
}